

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

int ConvexDecomposition::PolyHit
              (float3 *vert,int n,float3 *v0,float3 *v1,float3 *impact,float3 *normal)

{
  float3 *pfVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar6;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  float *pfVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  uVar15 = (ulong)(uint)n;
  countpolyhit = countpolyhit + 1;
  if (n < 1) {
    auVar25 = ZEXT816(0);
    fVar27 = 0.0;
  }
  else {
    pfVar19 = &vert->y;
    fVar27 = 0.0;
    uVar18 = 1;
    auVar26 = ZEXT816(0);
    do {
      uVar9 = (uVar18 + 1 & 0xffffffff) % uVar15;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)pfVar19;
      uVar17 = 0;
      if (uVar18 != uVar15) {
        uVar17 = uVar18;
      }
      auVar25 = vinsertps_avx(ZEXT416((uint)vert[uVar9].z),ZEXT416((uint)vert[uVar9].x),0x10);
      uVar5._0_4_ = vert[uVar17].y;
      uVar5._4_4_ = vert[uVar17].z;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar5;
      lVar2 = (1 - uVar15) + uVar18;
      pfVar1 = (float3 *)(pfVar19 + -1);
      pfVar19 = pfVar19 + 3;
      auVar32 = vsubps_avx(auVar21,auVar32);
      auVar21 = vpermt2ps_avx512vl(auVar21,_DAT_009d86b0,ZEXT416((uint)vert[uVar17].x));
      auVar25 = vsubps_avx(auVar25,auVar21);
      auVar29 = ZEXT416((uint)(vert[uVar17].x - pfVar1->x));
      auVar21 = vpermt2ps_avx512vl(auVar32,_DAT_009d86b0,auVar29);
      auVar30 = ZEXT416((uint)(vert[uVar9].y - (float)(undefined4)uVar5));
      auVar22 = vpermt2ps_avx512vl(auVar25,SUB6416(ZEXT464(4),0),auVar30);
      auVar31._0_4_ = auVar22._0_4_ * auVar21._0_4_;
      auVar31._4_4_ = auVar22._4_4_ * auVar21._4_4_;
      auVar31._8_4_ = auVar22._8_4_ * auVar21._8_4_;
      auVar31._12_4_ = auVar22._12_4_ * auVar21._12_4_;
      auVar21 = vfmsub231ps_fma(auVar31,auVar32,auVar25);
      auVar25 = vmovshdup_avx(auVar25);
      auVar32 = vfmsub231ss_fma(ZEXT416((uint)(auVar32._0_4_ * auVar25._0_4_)),auVar29,auVar30);
      auVar25._0_4_ = auVar21._0_4_ + auVar26._0_4_;
      auVar25._4_4_ = auVar21._4_4_ + auVar26._4_4_;
      auVar25._8_4_ = auVar21._8_4_ + auVar26._8_4_;
      auVar25._12_4_ = auVar21._12_4_ + auVar26._12_4_;
      fVar27 = fVar27 + auVar32._0_4_;
      uVar18 = uVar18 + 1;
      auVar26 = auVar25;
    } while (lVar2 != 1);
  }
  auVar26 = vmovshdup_avx(auVar25);
  fVar24 = auVar25._0_4_;
  fVar28 = auVar26._0_4_;
  auVar25 = ZEXT416((uint)(fVar27 * fVar27 + fVar24 * fVar24 + fVar28 * fVar28));
  auVar25 = vsqrtss_avx(auVar25,auVar25);
  fVar23 = auVar25._0_4_;
  if ((fVar23 != 0.0) || (iVar16 = 0, NAN(fVar23))) {
    fVar23 = 1.0 / fVar23;
    fVar24 = fVar24 * fVar23;
    fVar28 = fVar28 * fVar23;
    fVar27 = fVar27 * fVar23;
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * vert->y)),ZEXT416((uint)fVar24),
                              ZEXT416((uint)vert->x));
    auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * v0->y)),ZEXT416((uint)fVar24),
                              ZEXT416((uint)v0->x));
    auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar27),ZEXT416((uint)vert->z));
    auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar27),ZEXT416((uint)v0->z));
    fVar23 = auVar26._0_4_ - auVar25._0_4_;
    iVar16 = 0;
    if (0.0 <= fVar23) {
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * v1->y)),ZEXT416((uint)fVar24),
                                ZEXT416((uint)v1->x));
      auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar27),ZEXT416((uint)v1->z));
      fVar10 = auVar26._0_4_ - auVar25._0_4_;
      iVar16 = 0;
      if (fVar10 <= 0.0) {
        if (PolyHit(ConvexDecomposition::float3_const*,int,ConvexDecomposition::float3_const&,ConvexDecomposition::float3_const&,ConvexDecomposition::float3*,ConvexDecomposition::float3*)
            ::the_point == '\0') {
          PolyHit();
        }
        uVar3 = v1->x;
        uVar7 = v1->y;
        fVar23 = fVar23 / (fVar23 - fVar10);
        fVar10 = 1.0 - fVar23;
        uVar4 = v0->x;
        uVar8 = v0->y;
        PolyHit::the_point.z = fVar10 * v0->z + fVar23 * v1->z;
        auVar26._0_4_ = fVar10 * (float)uVar4 + fVar23 * (float)uVar3;
        auVar26._4_4_ = fVar10 * (float)uVar8 + fVar23 * (float)uVar7;
        auVar26._8_4_ = fVar10 * 0.0 + fVar23 * 0.0;
        auVar26._12_4_ = fVar10 * 0.0 + fVar23 * 0.0;
        PolyHit::the_point._0_8_ = vmovlps_avx(auVar26);
        if (0 < n) {
          auVar25 = vmovshdup_avx(auVar26);
          pfVar19 = &vert->z;
          uVar18 = 1;
          do {
            uVar9 = (uVar18 & 0xffffffff) % uVar15;
            fVar23 = vert[uVar9].y - pfVar19[-1];
            fVar10 = vert[uVar9].z - *pfVar19;
            fVar11 = auVar25._0_4_ - pfVar19[-1];
            fVar12 = vert[uVar9].x - ((float3 *)(pfVar19 + -2))->x;
            fVar13 = PolyHit::the_point.z - *pfVar19;
            fVar14 = auVar26._0_4_ - ((float3 *)(pfVar19 + -2))->x;
            auVar32 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * fVar11)),ZEXT416((uint)fVar23),
                                      ZEXT416((uint)fVar13));
            auVar21 = vfmsub231ss_fma(ZEXT416((uint)(fVar13 * fVar12)),ZEXT416((uint)fVar14),
                                      ZEXT416((uint)fVar10));
            auVar22 = vfmsub231ss_fma(ZEXT416((uint)(fVar23 * fVar14)),ZEXT416((uint)fVar12),
                                      ZEXT416((uint)fVar11));
            auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar28 * auVar21._0_4_)),ZEXT416((uint)fVar24),
                                      auVar32);
            auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar27),auVar22);
            if (auVar32._0_4_ < 0.0) break;
            pfVar19 = pfVar19 + 3;
            bVar20 = uVar18 < uVar15;
            uVar18 = uVar18 + 1;
          } while (bVar20);
          if (auVar32._0_4_ < 0.0) {
            return 0;
          }
        }
        if (normal != (float3 *)0x0) {
          auVar25 = vinsertps_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar28),0x10);
          uVar6 = vmovlps_avx(auVar25);
          normal->x = (float)(int)uVar6;
          normal->y = (float)(int)((ulong)uVar6 >> 0x20);
          normal->z = fVar27;
        }
        iVar16 = 1;
        if (impact != (float3 *)0x0) {
          impact->z = PolyHit::the_point.z;
          fVar27 = PolyHit::the_point.y;
          impact->x = PolyHit::the_point.x;
          impact->y = fVar27;
        }
      }
    }
  }
  return iVar16;
}

Assistant:

int PolyHit(const float3 *vert, const int n, const float3 &v0, const float3 &v1, float3 *impact, float3 *normal)
{
	countpolyhit++;
	int i;
	float3 nrml(0,0,0);
	for(i=0;i<n;i++) 
		{
		int i1=(i+1)%n;
		int i2=(i+2)%n;
		nrml = nrml + cross(vert[i1]-vert[i],vert[i2]-vert[i1]);
	}

	float m = magnitude(nrml);
	if(m==0.0)
		{
				return 0;
		}
	nrml = nrml * (1.0f/m);
	float dist = -dot(nrml,vert[0]);
	float d0,d1;
	if((d0=dot(v0,nrml)+dist) <0  ||  (d1=dot(v1,nrml)+dist) >0) 
		{        
				return 0;
		}

	static float3 the_point; 
	// By using the cached plane distances d0 and d1
	// we can optimize the following:
	//     the_point = planelineintersection(nrml,dist,v0,v1);
	float a = d0/(d0-d1);
	the_point = v0*(1-a) + v1*a;


	int inside=1;
	for(int j=0;inside && j<n;j++) 
		{
			// let inside = 0 if outside
			float3 pp1,pp2,side;
			pp1 = vert[j] ;
			pp2 = vert[(j+1)%n];
			side = cross((pp2-pp1),(the_point-pp1));
			inside = (dot(nrml,side) >= 0.0);
	}
	if(inside) 
		{
		if(normal){*normal=nrml;}
		if(impact){*impact=the_point;}
	}
	return inside;
}